

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * __thiscall
c4::MemoryResource::reallocate
          (MemoryResource *this,void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  bool bVar1;
  error_flags eVar2;
  void *pvVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  void *mem;
  
  pvVar3 = (void *)(**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  if (pvVar3 == (void *)0x0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0xccc,
                 "check failed: mem != nullptr\ncould not reallocate from %lu to %lu bytes",in_RDX,
                 in_RCX);
  }
  return pvVar3;
}

Assistant:

void* reallocate(void* ptr, size_t oldsz, size_t newsz, size_t alignment=alignof(max_align_t))
    {
        void *mem = this->do_reallocate(ptr, oldsz, newsz, alignment);
        C4_CHECK_MSG(mem != nullptr, "could not reallocate from %lu to %lu bytes", oldsz, newsz);
        return mem;
    }